

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

bool __thiscall
cursespp::ShortcutsWindow::ProcessMouseEvent(ShortcutsWindow *this,Event *mouseEvent)

{
  int iVar1;
  __shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<cursespp::ShortcutsWindow::Entry> entry;
  __shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((mouseEvent->state & 4) != 0) {
    p_Var2 = &((this->entries).
               super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var4 = &((this->entries).
                    super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>;
        p_Var4 != p_Var2; p_Var4 = p_Var4 + 1) {
      std::__shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,p_Var4);
      iVar1 = ((local_60._M_ptr)->position).offset;
      if ((iVar1 <= mouseEvent->x) && (mouseEvent->x < iVar1 + ((local_60._M_ptr)->position).width))
      {
        std::__cxx11::string::_M_assign((string *)&this->activeKey);
        (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
        if ((this->changedCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::__cxx11::string::string((string *)&local_50,(string *)&this->activeKey);
          std::
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::operator()(&this->changedCallback,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        return true;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
  }
  bVar3 = Window::ProcessMouseEvent(&this->super_Window,mouseEvent);
  return bVar3;
}

Assistant:

bool ShortcutsWindow::ProcessMouseEvent(const IMouseHandler::Event& mouseEvent) {
    if (mouseEvent.Button1Clicked()) {
        for (auto entry : this->entries) {
            auto& pos = entry->position;
            if (mouseEvent.x >= pos.offset &&
                mouseEvent.x < pos.offset + pos.width)
            {
                this->activeKey = entry->key;

                this->Redraw();

                if (this->changedCallback) {
                    this->changedCallback(this->activeKey);
                }

                return true;
            }
        }
    }
    return Window::ProcessMouseEvent(mouseEvent);
}